

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

bool __thiscall jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,Object *object)

{
  bool bVar1;
  int iVar2;
  Fodder *fodder;
  reference field_00;
  long in_RSI;
  FixNewlines *in_RDI;
  ObjectField *field;
  iterator __end2;
  iterator __begin2;
  ObjectFields *__range2;
  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_28;
  
  fodder = (Fodder *)(in_RSI + 0x80);
  local_28._M_current =
       (ObjectField *)
       std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                        *)in_RDI,
                       (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      iVar2 = countNewlines(fodder);
      return 0 < iVar2;
    }
    field_00 = __gnu_cxx::
               __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
               ::operator*(&local_28);
    objectFieldOpenFodder(in_RDI,field_00);
    iVar2 = countNewlines(fodder);
    if (0 < iVar2) break;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool shouldExpand(Object *object)
    {
        for (auto &field : object->fields) {
            if (countNewlines(objectFieldOpenFodder(field)) > 0) {
                return true;
            }
        }
        if (countNewlines(object->closeFodder) > 0) {
            return true;
        }
        return false;
    }